

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

uint __thiscall ON_Mesh::AppendDuplicateVertex(ON_Mesh *this,uint vertex_index)

{
  ON_3dPoint *pOVar1;
  ON_2dPoint *pOVar2;
  ON_SurfaceCurvature *pOVar3;
  ON_3fPoint *pOVar4;
  ON_3fVector *pOVar5;
  uint uVar6;
  ON_3fPoint V;
  undefined4 uStack_2c;
  
  uVar6 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  if (vertex_index < uVar6) {
    pOVar4 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
    stack0xffffffffffffffd0 = (double)CONCAT44(uStack_2c,pOVar4[vertex_index].z);
    pOVar4 = pOVar4 + vertex_index;
    V.x = pOVar4->x;
    V.y = pOVar4->y;
    ON_SimpleArray<ON_3fPoint>::Append(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,&V);
    if (uVar6 == (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count) {
      pOVar1 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a + vertex_index;
      V._0_8_ = pOVar1->x;
      unique0x10000144 = pOVar1->y;
      ON_SimpleArray<ON_3dPoint>::Append
                (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)&V);
    }
    if (uVar6 == (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count) {
      pOVar5 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
      stack0xffffffffffffffd0 = (double)CONCAT44(uStack_2c,pOVar5[vertex_index].z);
      pOVar5 = pOVar5 + vertex_index;
      V.x = pOVar5->x;
      V.y = pOVar5->y;
      ON_SimpleArray<ON_3fVector>::Append
                (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)&V);
    }
    if (uVar6 == (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count) {
      V._0_8_ = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a[vertex_index];
      ON_SimpleArray<ON_2fPoint>::Append
                (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)&V);
    }
    if (uVar6 == (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count) {
      pOVar2 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a + vertex_index;
      V._0_8_ = pOVar2->x;
      unique0x10000164 = pOVar2->y;
      ON_SimpleArray<ON_2dPoint>::Append
                (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,(ON_2dPoint *)&V);
    }
    if (uVar6 == (this->m_K).m_count) {
      pOVar3 = (this->m_K).m_a + vertex_index;
      V._0_8_ = pOVar3->k1;
      unique0x10000184 = pOVar3->k2;
      ON_SimpleArray<ON_SurfaceCurvature>::Append(&this->m_K,(ON_SurfaceCurvature *)&V);
    }
    if (uVar6 == (this->m_C).m_count) {
      V.x = (float)(this->m_C).m_a[vertex_index].field_0.m_color;
      ON_SimpleArray<ON_Color>::Append(&this->m_C,(ON_Color *)&V);
    }
    if (uVar6 == (this->m_H).m_count) {
      V.x._0_1_ = (this->m_H).m_a[vertex_index];
      ON_SimpleArray<bool>::Append(&this->m_H,(bool *)&V);
    }
  }
  else {
    uVar6 = 0xffffffff;
  }
  return uVar6;
}

Assistant:

bool
ON_MeshFace::IsValid(int mesh_vertex_count) const
{
  return (vi[0] >= 0 && vi[0] < mesh_vertex_count
    && vi[1] >= 0 && vi[1] < mesh_vertex_count
    && vi[2] >= 0 && vi[2] < mesh_vertex_count
    && vi[3] >= 0 && vi[3] < mesh_vertex_count
    && vi[0] != vi[1] && vi[1] != vi[2] && vi[2] != vi[0]
    && (vi[2] == vi[3] || (vi[0] != vi[3] && vi[1] != vi[3])));
}